

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_ExtractAndInsertNodeHandleMultiSet_Test::
~Btree_ExtractAndInsertNodeHandleMultiSet_Test(Btree_ExtractAndInsertNodeHandleMultiSet_Test *this)

{
  Btree_ExtractAndInsertNodeHandleMultiSet_Test *this_local;
  
  ~Btree_ExtractAndInsertNodeHandleMultiSet_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, ExtractAndInsertNodeHandleMultiSet) {
        phmap::btree_multiset<int> src1 = {1, 2, 3, 3, 4, 5};
        auto nh = src1.extract(src1.find(3));
        EXPECT_THAT(src1, ElementsAre(1, 2, 3, 4, 5));
        phmap::btree_multiset<int> other;
        auto res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res, other.find(3));

        phmap::btree_multiset<int> src2 = {3, 4};
        nh = src2.extract(src2.find(3));
        EXPECT_THAT(src2, ElementsAre(4));
        res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3, 3));
        EXPECT_EQ(res, ++other.find(3));
    }